

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O2

void __thiscall Fluid_Image::write_static(Fluid_Image *this)

{
  Fl_Shared_Image *pFVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  int iVar6;
  long lVar7;
  int ncolors;
  int chars_per_color;
  
  if (this->img != (Fl_Shared_Image *)0x0) {
    _ncolors = in_RAX;
    pcVar3 = fl_filename_name(this->name_);
    pcVar3 = unique_id(this,"idata",pcVar3,(char *)0x0);
    pcVar4 = fl_filename_name(this->name_);
    pcVar4 = unique_id(this,"image",pcVar4,(char *)0x0);
    this->function_name_ = pcVar4;
    if ((this->img->super_Fl_Image).count_ < 2) {
      if ((this->img->super_Fl_Image).d_ == 0) {
        write_c("\n");
        if (bitmap_header_written != write_number) {
          write_c("#include <FL/Fl_Bitmap.H>\n");
          bitmap_header_written = write_number;
        }
        write_c("static const unsigned char %s[] =\n",pcVar3);
        pFVar1 = this->img;
        write_cdata(*(pFVar1->super_Fl_Image).data_,
                    (((pFVar1->super_Fl_Image).w_ + 7) / 8) * (pFVar1->super_Fl_Image).h_);
        write_c(";\n");
        write_initializer(this,"Fl_Bitmap","%s, %d, %d",pcVar3,
                          (ulong)(uint)(this->img->super_Fl_Image).w_,
                          (ulong)(uint)(this->img->super_Fl_Image).h_);
        return;
      }
      pcVar4 = fl_filename_ext(this->name_);
      iVar2 = strcmp(pcVar4,".jpg");
      write_c("\n");
      if (iVar2 == 0) {
        if (jpeg_header_written != write_number) {
          write_c("#include <FL/Fl_JPEG_Image.H>\n");
          jpeg_header_written = write_number;
        }
        write_c("static const unsigned char %s[] =\n",pcVar3);
        __stream = (FILE *)fl_fopen(this->name_,"rb");
        if (__stream != (FILE *)0x0) {
          fseek(__stream,0,2);
          sVar5 = ftell(__stream);
          fseek(__stream,0,0);
          if (sVar5 != 0) {
            pcVar4 = (char *)calloc(sVar5,1);
            fread(pcVar4,sVar5,1,__stream);
            write_cdata(pcVar4,(int)sVar5);
            free(pcVar4);
          }
          fclose(__stream);
        }
        write_c(";\n");
        pcVar4 = fl_filename_name(this->name_);
        write_initializer(this,"Fl_JPEG_Image","\"%s\", %s",pcVar4,pcVar3);
        return;
      }
      if (image_header_written != write_number) {
        write_c("#include <FL/Fl_Image.H>\n");
        image_header_written = write_number;
      }
      write_c("static const unsigned char %s[] =\n",pcVar3);
      pFVar1 = this->img;
      iVar2 = (pFVar1->super_Fl_Image).ld_;
      iVar6 = (pFVar1->super_Fl_Image).d_ * (pFVar1->super_Fl_Image).w_;
      if (iVar2 != 0) {
        iVar6 = iVar2;
      }
      write_cdata(*(pFVar1->super_Fl_Image).data_,iVar6 * (pFVar1->super_Fl_Image).h_);
      write_c(";\n");
      pFVar1 = this->img;
      write_initializer(this,"Fl_RGB_Image","%s, %d, %d, %d, %d",pcVar3,
                        (ulong)(uint)(pFVar1->super_Fl_Image).w_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).h_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).d_,
                        (ulong)(uint)(pFVar1->super_Fl_Image).ld_);
    }
    else {
      write_c("\n");
      if (pixmap_header_written != write_number) {
        write_c("#include <FL/Fl_Pixmap.H>\n");
        pixmap_header_written = write_number;
      }
      write_c("static const char *%s[] = {\n",pcVar3);
      pcVar4 = *(this->img->super_Fl_Image).data_;
      sVar5 = strlen(pcVar4);
      write_cstring(pcVar4,(int)sVar5);
      __isoc99_sscanf(*(this->img->super_Fl_Image).data_,"%*d%*d%d%d",&ncolors,&chars_per_color);
      if (ncolors < 0) {
        write_c(",\n");
        write_cstring((this->img->super_Fl_Image).data_[1],ncolors * -4);
        lVar7 = 2;
      }
      else {
        for (lVar7 = 1; lVar7 <= ncolors; lVar7 = lVar7 + 1) {
          write_c(",\n");
          pcVar4 = (this->img->super_Fl_Image).data_[lVar7];
          sVar5 = strlen(pcVar4);
          write_cstring(pcVar4,(int)sVar5);
        }
      }
      for (; lVar7 < (this->img->super_Fl_Image).count_; lVar7 = lVar7 + 1) {
        write_c(",\n");
        write_cstring((this->img->super_Fl_Image).data_[lVar7],
                      chars_per_color * (this->img->super_Fl_Image).w_);
      }
      write_c("\n};\n");
      write_initializer(this,"Fl_Pixmap","%s",pcVar3);
    }
  }
  return;
}

Assistant:

void Fluid_Image::write_static() {
  if (!img) return;
  const char *idata_name = unique_id(this, "idata", fl_filename_name(name()), 0);
  function_name_ = unique_id(this, "image", fl_filename_name(name()), 0);
  if (img->count() > 1) {
    // Write Pixmap data...
    write_c("\n");
    if (pixmap_header_written != write_number) {
      write_c("#include <FL/Fl_Pixmap.H>\n");
      pixmap_header_written = write_number;
    }
    write_c("static const char *%s[] = {\n", idata_name);
    write_cstring(img->data()[0], strlen(img->data()[0]));

    int i;
    int ncolors, chars_per_color;
    sscanf(img->data()[0], "%*d%*d%d%d", &ncolors, &chars_per_color);

    if (ncolors < 0) {
      write_c(",\n");
      write_cstring(img->data()[1], ncolors * -4);
      i = 2;
    } else {
      for (i = 1; i <= ncolors; i ++) {
        write_c(",\n");
        write_cstring(img->data()[i], strlen(img->data()[i]));
      }
    }
    for (; i < img->count(); i ++) {
      write_c(",\n");
      write_cstring(img->data()[i], img->w() * chars_per_color);
    }
    write_c("\n};\n");
    write_initializer("Fl_Pixmap", "%s", idata_name);
  } else if (img->d() == 0) {
    // Write Bitmap data...
    write_c("\n");
    if (bitmap_header_written != write_number) {
      write_c("#include <FL/Fl_Bitmap.H>\n");
      bitmap_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);
    write_cdata(img->data()[0], ((img->w() + 7) / 8) * img->h());
    write_c(";\n");
    write_initializer( "Fl_Bitmap", "%s, %d, %d", idata_name, img->w(), img->h());
  } else if (strcmp(fl_filename_ext(name()), ".jpg")==0) {
    // Write jpeg image data...
    write_c("\n");
    if (jpeg_header_written != write_number) {
      write_c("#include <FL/Fl_JPEG_Image.H>\n");
      jpeg_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);

    FILE *f = fl_fopen(name(), "rb");
    if (!f) {
      // message = "Can't include binary file. Can't open";
    } else {
      fseek(f, 0, SEEK_END);
      size_t nData = ftell(f);
      fseek(f, 0, SEEK_SET);
      if (nData) {
        char *data = (char*)calloc(nData, 1);
        if (fread(data, nData, 1, f)==0) { /* ignore */ }
        write_cdata(data, nData);
        free(data);
      }
      fclose(f);
    }
    
    write_c(";\n");
    write_initializer("Fl_JPEG_Image", "\"%s\", %s", fl_filename_name(name()), idata_name);
  } else {
    // Write image data...
    write_c("\n");
    if (image_header_written != write_number) {
      write_c("#include <FL/Fl_Image.H>\n");
      image_header_written = write_number;
    } 
    write_c("static const unsigned char %s[] =\n", idata_name);
    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;
    write_cdata(img->data()[0], (img->w() * img->d() + extra_data) * img->h());
    write_c(";\n");
    write_initializer("Fl_RGB_Image", "%s, %d, %d, %d, %d", idata_name, img->w(), img->h(), img->d(), img->ld());
  }
}